

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

Vec_Ptr_t * Aig_ManSupports(Aig_Man_t *pMan)

{
  uint *puVar1;
  Part_One_t *p1;
  uint uVar2;
  int iVar3;
  long lVar4;
  Part_Man_t *pMan_00;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Int_t *p;
  Part_One_t *pPVar8;
  uint *puVar9;
  int iVar10;
  Part_One_t *p2;
  uint uVar11;
  
  pVVar5 = pMan->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      *(long *)pVVar5->pArray[lVar4] = lVar4;
      lVar4 = lVar4 + 1;
      pVVar5 = pMan->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = pMan->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      *(long *)pVVar5->pArray[lVar4] = lVar4;
      lVar4 = lVar4 + 1;
      pVVar5 = pMan->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  pMan_00 = Part_ManStart(0x100000,0x40);
  iVar3 = pMan->nObjs[3];
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar10 = 8;
  if (6 < iVar3 - 1U) {
    iVar10 = iVar3;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar10;
  if (iVar10 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar10 << 3);
  }
  pVVar5->pArray = ppvVar6;
  Aig_ManCleanData(pMan);
  pVVar7 = pMan->vObjs;
  if (0 < pVVar7->nSize) {
    lVar4 = 0;
    do {
      puVar1 = (uint *)pVVar7->pArray[lVar4];
      if (puVar1 != (uint *)0x0) {
        uVar11 = (uint)*(undefined8 *)(puVar1 + 6);
        if ((uVar11 & 7) - 7 < 0xfffffffe) {
          uVar2 = uVar11 & 7;
          if (uVar2 == 2) {
            if (0x3f < uVar11) {
              puVar9 = (uint *)Part_ManFetch(pMan_00,0x10);
              *puVar9 = uVar11 >> 6;
              puVar9[1] = 0;
              puVar9[2] = 1;
              uVar11 = *puVar1;
              puVar9[1] = 1;
              puVar9[3] = uVar11;
LAB_006bbce1:
              *(uint **)(puVar1 + 10) = puVar9;
            }
          }
          else {
            if (uVar2 == 3) {
              p2 = *(Part_One_t **)((*(ulong *)(puVar1 + 2) & 0xfffffffffffffffe) + 0x28);
              p = Part_ManTransferEntry(p2);
              Vec_IntPush(p,*puVar1);
              uVar11 = pVVar5->nSize;
              uVar2 = pVVar5->nCap;
              if (uVar11 == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (pVVar5->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
                  }
                  iVar3 = 0x10;
                }
                else {
                  iVar3 = uVar2 * 2;
                  if (iVar3 <= (int)uVar2) goto LAB_006bbd28;
                  if (pVVar5->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
                  }
                  else {
                    ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar2 << 4);
                  }
                }
                pVVar5->pArray = ppvVar6;
                pVVar5->nCap = iVar3;
              }
LAB_006bbd28:
              pVVar5->nSize = uVar11 + 1;
              pVVar5->pArray[(int)uVar11] = p;
              iVar3 = p2->nRefs;
              if (iVar3 < 1) {
                __assert_fail("pPart0->nRefs > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                              ,0x13a,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
              }
              goto LAB_006bbd43;
            }
            if (((ulong)puVar1 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
            }
            if (uVar2 != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                            ,0x14f,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
            }
            if (0x3f < uVar11) {
              puVar9 = (uint *)Part_ManFetch(pMan_00,0xc);
              *puVar9 = uVar11 >> 6;
              puVar9[1] = 0;
              puVar9[2] = 0;
              goto LAB_006bbce1;
            }
          }
        }
        else {
          p1 = *(Part_One_t **)((*(ulong *)(puVar1 + 2) & 0xfffffffffffffffe) + 0x28);
          p2 = *(Part_One_t **)((*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe) + 0x28);
          pPVar8 = Part_ManMergeEntry(pMan_00,p1,p2,uVar11 >> 6);
          *(Part_One_t **)(puVar1 + 10) = pPVar8;
          if (p1->nRefs < 1) {
            __assert_fail("pPart0->nRefs > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                          ,0x12a,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
          }
          iVar3 = p1->nRefs + -1;
          p1->nRefs = iVar3;
          if (iVar3 == 0) {
            iVar3 = p1->nOutsAlloc;
            if (iVar3 < p1->nOuts) goto LAB_006bbe94;
            if (p1->nOuts < iVar3 / 2) goto LAB_006bbe75;
            Part_ManRecycle(pMan_00,(char *)p1,iVar3 * 4 + 0xc);
          }
          iVar3 = p2->nRefs;
          if (iVar3 < 1) {
            __assert_fail("pPart1->nRefs > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                          ,0x12d,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
          }
LAB_006bbd43:
          p2->nRefs = iVar3 + -1;
          if (iVar3 + -1 == 0) {
            iVar3 = p2->nOutsAlloc;
            if (iVar3 < p2->nOuts) {
LAB_006bbe94:
              __assert_fail("pEntry->nOuts <= pEntry->nOutsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                            ,0xc4,"void Part_ManRecycleEntry(Part_Man_t *, Part_One_t *)");
            }
            if (p2->nOuts < iVar3 / 2) {
LAB_006bbe75:
              __assert_fail("pEntry->nOuts >= pEntry->nOutsAlloc/2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                            ,0xc5,"void Part_ManRecycleEntry(Part_Man_t *, Part_One_t *)");
            }
            Part_ManRecycle(pMan_00,(char *)p2,iVar3 * 4 + 0xc);
          }
        }
      }
      lVar4 = lVar4 + 1;
      pVVar7 = pMan->vObjs;
    } while (lVar4 < pVVar7->nSize);
  }
  Part_ManStop(pMan_00);
  qsort(pVVar5->pArray,(long)pVVar5->nSize,8,Vec_VecSortCompare2);
  pVVar7 = pMan->vCis;
  if (0 < pVVar7->nSize) {
    lVar4 = 0;
    do {
      *(undefined8 *)pVVar7->pArray[lVar4] = 0;
      lVar4 = lVar4 + 1;
      pVVar7 = pMan->vCis;
    } while (lVar4 < pVVar7->nSize);
  }
  pVVar7 = pMan->vCos;
  if (0 < pVVar7->nSize) {
    lVar4 = 0;
    do {
      *(undefined8 *)pVVar7->pArray[lVar4] = 0;
      lVar4 = lVar4 + 1;
      pVVar7 = pMan->vCos;
    } while (lVar4 < pVVar7->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Aig_ManSupports( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSupports;
    Vec_Int_t * vSupp;
    Part_Man_t * p;
    Part_One_t * pPart0, * pPart1;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    // set the number of PIs/POs
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pNext = (Aig_Obj_t *)(long)i;
    Aig_ManForEachCo( pMan, pObj, i )
        pObj->pNext = (Aig_Obj_t *)(long)i;
    // start the support computation manager
    p = Part_ManStart( 1 << 20, 1 << 6 );
    // consider objects in the topological order
    vSupports = Vec_PtrAlloc( Aig_ManCoNum(pMan) );
    Aig_ManCleanData(pMan);
    Aig_ManForEachObj( pMan, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            pPart0 = (Part_One_t *)Aig_ObjFanin0(pObj)->pData;
            pPart1 = (Part_One_t *)Aig_ObjFanin1(pObj)->pData;
            pObj->pData = Part_ManMergeEntry( p, pPart0, pPart1, pObj->nRefs );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart0 );
            assert( pPart1->nRefs > 0 );
            if ( --pPart1->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart1 );
            if ( ((Part_One_t *)pObj->pData)->nOuts <= 16 )
                Counter++;
            continue;
        }
        if ( Aig_ObjIsCo(pObj) )
        {
            pPart0 = (Part_One_t *)Aig_ObjFanin0(pObj)->pData;
            vSupp = Part_ManTransferEntry(pPart0);
            Vec_IntPush( vSupp, (int)(long)pObj->pNext );
            Vec_PtrPush( vSupports, vSupp );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart0 );
            continue;
        }
        if ( Aig_ObjIsCi(pObj) )
        {
            if ( pObj->nRefs )
            {
                pPart0 = Part_ManFetchEntry( p, 1, pObj->nRefs );
                pPart0->pOuts[ pPart0->nOuts++ ] = (int)(long)pObj->pNext;
                pObj->pData = pPart0;
            }
            continue;
        }
        if ( Aig_ObjIsConst1(pObj) )
        {
            if ( pObj->nRefs )
                pObj->pData = Part_ManFetchEntry( p, 0, pObj->nRefs );
            continue;
        }
        assert( 0 );
    }
//printf( "Memory usage = %d MB.\n", Vec_PtrSize(p->vMemory) * p->nChunkSize / (1<<20) );
    Part_ManStop( p );
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
    // clear the number of PIs/POs
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pNext = NULL;
    Aig_ManForEachCo( pMan, pObj, i )
        pObj->pNext = NULL;
/*
    Aig_ManForEachCo( pMan, pObj, i )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vSupports, i) ) );
    printf( "\n" );
*/
//    printf( "%d \n", Counter );
    return vSupports;
}